

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderFieldParsingCases
          (MessageBuilderGenerator *this,Printer *printer)

{
  FieldDescriptor *field_00;
  bool bVar1;
  int iVar2;
  FieldDescriptor **__p;
  type ppFVar3;
  FieldDescriptor *field;
  int local_24;
  int i;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  sorted_fields._M_t.
  super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
        )(__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
          )printer;
  __p = SortFieldsByNumber(this->descriptor_);
  std::
  unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
  ::
  unique_ptr<google::protobuf::FieldDescriptor_const**,std::default_delete<google::protobuf::FieldDescriptor_const*[]>,void,bool>
            ((unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
              *)&stack0xffffffffffffffe0,__p);
  for (local_24 = 0; iVar2 = Descriptor::field_count(this->descriptor_), local_24 < iVar2;
      local_24 = local_24 + 1) {
    ppFVar3 = std::
              unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
              ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                            *)&stack0xffffffffffffffe0,(long)local_24);
    field_00 = *ppFVar3;
    GenerateBuilderFieldParsingCase
              (this,(Printer *)
                    sorted_fields._M_t.
                    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                    _M_head_impl,field_00);
    bVar1 = FieldDescriptor::is_packable(field_00);
    if (bVar1) {
      GenerateBuilderPackedFieldParsingCase
                (this,(Printer *)
                      sorted_fields._M_t.
                      super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                      .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                      _M_head_impl,field_00);
    }
  }
  std::
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  ::~unique_ptr((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderFieldParsingCases(
    io::Printer* printer) {
  std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
      SortFieldsByNumber(descriptor_));
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    GenerateBuilderFieldParsingCase(printer, field);
    if (field->is_packable()) {
      GenerateBuilderPackedFieldParsingCase(printer, field);
    }
  }
}